

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_builtin(CompilerMSL *this,string *ep_args)

{
  IndexType IVar1;
  bool bVar2;
  uint32_t uVar3;
  ExecutionModel EVar4;
  ulong uVar5;
  SPIRType *pSVar6;
  Vector<std::function<void_()>_> *pVVar7;
  spirv_cross local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548 [32];
  spirv_cross local_528 [32];
  spirv_cross local_508 [32];
  undefined1 local_4e8 [64];
  spirv_cross local_4a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488 [32];
  spirv_cross local_468 [32];
  spirv_cross local_448 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [32];
  spirv_cross local_408 [32];
  spirv_cross local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [32];
  spirv_cross local_3a8 [32];
  anon_class_16_2_fd512dd0 local_388;
  function<void_()> local_378;
  anon_class_16_2_fd512dd0 local_358;
  function<void_()> local_348;
  SPIRFunction *local_328;
  SPIRFunction *entry_func_1;
  SPIRFunction *local_318;
  function<void_()> local_310;
  SPIRFunction *local_2f0;
  SPIRFunction *entry_func;
  SPIRConstant *c;
  uint32_t *local_2d8;
  TypedID<(spirv_cross::Types)0> *local_2d0;
  uint32_t local_2c8;
  TypedID<(spirv_cross::Types)0> local_2c4;
  uint32_t inner_factor_initializer_id;
  uint32_t outer_factor_initializer_id;
  undefined1 local_2a0 [64];
  spirv_cross local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  spirv_cross local_220 [32];
  spirv_cross local_200 [32];
  spirv_cross local_1e0 [32];
  spirv_cross local_1c0 [32];
  spirv_cross local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  spirv_cross local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [36];
  TypedID<(spirv_cross::Types)1> local_fc;
  Variant *local_f8;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *var;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *__end1;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *__begin1;
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> *__range1;
  anon_class_24_3_d510e71b local_c8;
  undefined1 local_b0 [8];
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> active_builtins;
  string *ep_args_local;
  CompilerMSL *this_local;
  
  active_builtins.stack_storage.aligned_char._120_8_ = ep_args;
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::SmallVector
            ((SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> *)local_b0);
  local_c8.ep_args = (string *)active_builtins.stack_storage.aligned_char._120_8_;
  local_c8.this = this;
  local_c8.active_builtins =
       (SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> *)local_b0;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::entry_point_args_builtin(std::__cxx11::string&)::__3>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_c8);
  __begin1 = (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)local_b0;
  __end1 = VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>::begin
                     ((VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_> *)__begin1)
  ;
  var = VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>::end
                  ((VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_> *)__begin1);
  for (; __end1 != var; __end1 = __end1 + 1) {
    local_f8 = (Variant *)__end1;
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(__end1->first->super_IVariant).field_0xc);
    uVar3 = ensure_correct_builtin_type(this,uVar3,*(BuiltIn *)&local_f8->holder);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_fc,uVar3);
    *(uint32_t *)&(((SPIRVariable *)local_f8->group)->super_IVariant).field_0xc = local_fc.id;
  }
  if (this->needs_base_vertex_arg == Yes) {
    ::std::__cxx11::string::empty();
    built_in_func_arg_abi_cxx11_((CompilerMSL *)local_120,(BuiltIn)this,true);
    ::std::__cxx11::string::operator+=
              ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_120);
    ::std::__cxx11::string::~string((string *)local_120);
  }
  if (this->needs_base_instance_arg == Yes) {
    ::std::__cxx11::string::empty();
    built_in_func_arg_abi_cxx11_((CompilerMSL *)local_140,(BuiltIn)this,true);
    ::std::__cxx11::string::operator+=
              ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_140);
    ::std::__cxx11::string::~string((string *)local_140);
  }
  if ((this->capture_output_to_buffer & 1U) != 0) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
    if (uVar3 != 0) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      pSVar6 = get_stage_out_struct_type(this);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_180,this,pSVar6,0);
      join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                (local_160,(char (*) [8])0x5fef05,local_180,(char (*) [3])0x5e923a,
                 &this->output_buffer_var_name,(char (*) [11])0x5feead,
                 &(this->msl_options).shader_output_buffer_index,(char (*) [4])")]]");
      ::std::__cxx11::string::operator+=
                ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_160);
      ::std::__cxx11::string::~string((string *)local_160);
      ::std::__cxx11::string::~string((string *)local_180);
    }
    bVar2 = is_tesc_shader(this);
    if (bVar2) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      join<char_const(&)[43],unsigned_int&,char_const(&)[4]>
                (local_1a0,(char (*) [43])"constant uint* spvIndirectParams [[buffer(",
                 &(this->msl_options).indirect_params_buffer_index,(char (*) [4])")]]");
      ::std::__cxx11::string::operator+=
                ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_1a0);
      ::std::__cxx11::string::~string((string *)local_1a0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
      if ((uVar3 != 0) &&
         ((EVar4 = Compiler::get_execution_model((Compiler *)this), EVar4 != ExecutionModelVertex ||
          (((this->msl_options).vertex_for_tessellation & 1U) == 0)))) {
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
        }
        join<char_const(&)[41],unsigned_int&,char_const(&)[4]>
                  (local_1c0,(char (*) [41])"device uint* spvIndirectParams [[buffer(",
                   &(this->msl_options).indirect_params_buffer_index,(char (*) [4])")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_1c0)
        ;
        ::std::__cxx11::string::~string((string *)local_1c0);
      }
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if ((((EVar4 == ExecutionModelVertex) &&
         (((this->msl_options).vertex_for_tessellation & 1U) != 0)) &&
        ((bVar2 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x2a)
         , bVar2 ||
         (bVar2 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,5),
         bVar2)))) && ((this->msl_options).vertex_index_type != None)) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      IVar1 = (this->msl_options).vertex_index_type;
      if (IVar1 != None) {
        if (IVar1 == UInt16) {
          join<char_const(&)[22],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                    (local_1e0,(char (*) [22])"const device ushort* ",&this->index_buffer_var_name,
                     (char (*) [11])0x5feead,&(this->msl_options).shader_index_buffer_index,
                     (char (*) [4])")]]");
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,
                     (string *)local_1e0);
          ::std::__cxx11::string::~string((string *)local_1e0);
        }
        else if (IVar1 == UInt32) {
          join<char_const(&)[20],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                    (local_200,(char (*) [20])"const device uint* ",&this->index_buffer_var_name,
                     (char (*) [11])0x5feead,&(this->msl_options).shader_index_buffer_index,
                     (char (*) [4])")]]");
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,
                     (string *)local_200);
          ::std::__cxx11::string::~string((string *)local_200);
        }
      }
    }
    bVar2 = is_tesc_shader(this);
    if (bVar2) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_out_var_id);
      if (uVar3 != 0) {
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
        }
        pSVar6 = get_patch_stage_out_struct_type(this);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_240,this,pSVar6,0);
        convert_to_string<unsigned_int,_0>
                  (local_260,&(this->msl_options).shader_patch_output_buffer_index);
        join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                  (local_220,(char (*) [8])0x5fef05,local_240,(char (*) [3])0x5e923a,
                   &this->patch_output_buffer_var_name,(char (*) [11])0x5feead,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   (char (*) [4])")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_220)
        ;
        ::std::__cxx11::string::~string((string *)local_220);
        ::std::__cxx11::string::~string((string *)local_260);
        ::std::__cxx11::string::~string((string *)local_240);
      }
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      get_tess_factor_struct_name_abi_cxx11_((CompilerMSL *)local_2a0);
      convert_to_string<unsigned_int,_0>
                ((spirv_cross *)&inner_factor_initializer_id,
                 &(this->msl_options).shader_tess_factor_buffer_index);
      join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((spirv_cross *)(local_2a0 + 0x20),(char (*) [8])0x5fef05,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                 (char (*) [3])0x5e923a,&this->tess_factor_buffer_var_name,(char (*) [11])0x5feead,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &inner_factor_initializer_id,(char (*) [4])")]]");
      ::std::__cxx11::string::operator+=
                ((string *)active_builtins.stack_storage.aligned_char._120_8_,
                 (string *)(local_2a0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
      ::std::__cxx11::string::~string((string *)&inner_factor_initializer_id);
      ::std::__cxx11::string::~string((string *)local_2a0);
      local_2c4.id = 0;
      local_2c8 = 0;
      local_2d8 = &local_2c8;
      local_2d0 = &local_2c4;
      c = (SPIRConstant *)this;
      ParsedIR::
      for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::entry_point_args_builtin(std::__cxx11::string&)::__4>
                (&(this->super_CompilerGLSL).super_Compiler.ir,(anon_class_24_3_4b19f998 *)&c);
      entry_func = (SPIRFunction *)0x0;
      if ((local_2c4.id != 0) &&
         (entry_func = (SPIRFunction *)
                       Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,local_2c4.id)
         , entry_func != (SPIRFunction *)0x0)) {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)
                           &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
        local_2f0 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
        pVVar7 = &local_2f0->fixup_hooks_in;
        local_318 = entry_func;
        entry_func_1 = (SPIRFunction *)this;
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::entry_point_args_builtin(std::__cxx11::string&)::__0,void>
                  ((function<void()> *)&local_310,(anon_class_16_2_fd512dd0 *)&entry_func_1);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar7,&local_310);
        ::std::function<void_()>::~function(&local_310);
      }
      if ((local_2c8 != 0) &&
         (entry_func = (SPIRFunction *)
                       Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,local_2c8),
         entry_func != (SPIRFunction *)0x0)) {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)
                           &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
        local_328 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
        bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
        if (bVar2) {
          pVVar7 = &local_328->fixup_hooks_in;
          local_358.c = (SPIRConstant *)entry_func;
          local_358.this = this;
          ::std::function<void()>::
          function<spirv_cross::CompilerMSL::entry_point_args_builtin(std::__cxx11::string&)::__1,void>
                    ((function<void()> *)&local_348,&local_358);
          SmallVector<std::function<void_()>,_0UL>::push_back(pVVar7,&local_348);
          ::std::function<void_()>::~function(&local_348);
        }
        else {
          pVVar7 = &local_328->fixup_hooks_in;
          local_388.c = (SPIRConstant *)entry_func;
          local_388.this = this;
          ::std::function<void()>::
          function<spirv_cross::CompilerMSL::entry_point_args_builtin(std::__cxx11::string&)::__2,void>
                    ((function<void()> *)&local_378,&local_388);
          SmallVector<std::function<void_()>,_0UL>::push_back(pVVar7,&local_378);
          ::std::function<void_()>::~function(&local_378);
        }
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
      if (uVar3 != 0) {
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
        }
        if (((this->msl_options).multi_patch_workgroup & 1U) == 0) {
          pSVar6 = get_stage_in_struct_type(this);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_428,this,pSVar6,0)
          ;
          convert_to_string<unsigned_int,_0>(local_448,&(this->msl_options).shader_input_wg_index);
          join<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[16],std::__cxx11::string,char_const(&)[4]>
                    (local_408,(char (*) [13])"threadgroup ",local_428,(char (*) [3])0x5e923a,
                     &this->input_wg_var_name,(char (*) [16])" [[threadgroup(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                     (char (*) [4])")]]");
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,
                     (string *)local_408);
          ::std::__cxx11::string::~string((string *)local_408);
          ::std::__cxx11::string::~string((string *)local_448);
          ::std::__cxx11::string::~string((string *)local_428);
        }
        else {
          pSVar6 = get_stage_in_struct_type(this);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_3c8,this,pSVar6,0)
          ;
          convert_to_string<unsigned_int,_0>
                    (local_3e8,&(this->msl_options).shader_input_buffer_index);
          join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                    (local_3a8,(char (*) [8])0x5fef05,local_3c8,(char (*) [3])0x5e923a,
                     &this->input_buffer_var_name,(char (*) [11])0x5feead,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                     (char (*) [4])")]]");
          ::std::__cxx11::string::operator+=
                    ((string *)active_builtins.stack_storage.aligned_char._120_8_,
                     (string *)local_3a8);
          ::std::__cxx11::string::~string((string *)local_3a8);
          ::std::__cxx11::string::~string((string *)local_3e8);
          ::std::__cxx11::string::~string((string *)local_3c8);
        }
      }
    }
  }
  bVar2 = is_tese_shader(this);
  if ((bVar2) && (((this->msl_options).raw_buffer_tese_input & 1U) != 0)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_in_var_id);
    if (uVar3 != 0) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      pSVar6 = get_patch_stage_in_struct_type(this);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_488,this,pSVar6,0);
      convert_to_string<unsigned_int,_0>
                (local_4a8,&(this->msl_options).shader_patch_input_buffer_index);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                (local_468,(char (*) [14])"const device ",local_488,(char (*) [3])0x5e923a,
                 &this->patch_input_buffer_var_name,(char (*) [11])0x5feead,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                 (char (*) [4])")]]");
      ::std::__cxx11::string::operator+=
                ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_468);
      ::std::__cxx11::string::~string((string *)local_468);
      ::std::__cxx11::string::~string((string *)local_4a8);
      ::std::__cxx11::string::~string((string *)local_488);
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->tess_level_inner_var_id);
    if ((uVar3 != 0) ||
       (uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->tess_level_outer_var_id),
       uVar3 != 0)) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      get_tess_factor_struct_name_abi_cxx11_((CompilerMSL *)local_4e8);
      convert_to_string<unsigned_int,_0>
                (local_508,&(this->msl_options).shader_tess_factor_buffer_index);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((spirv_cross *)(local_4e8 + 0x20),(char (*) [14])"const device ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                 (char (*) [3])0x5e923a,&this->tess_factor_buffer_var_name,(char (*) [11])0x5feead,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
                 (char (*) [4])")]]");
      ::std::__cxx11::string::operator+=
                ((string *)active_builtins.stack_storage.aligned_char._120_8_,
                 (string *)(local_4e8 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_4e8 + 0x20));
      ::std::__cxx11::string::~string((string *)local_508);
      ::std::__cxx11::string::~string((string *)local_4e8);
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    if (uVar3 != 0) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)active_builtins.stack_storage.aligned_char._120_8_,", ");
      }
      pSVar6 = get_stage_in_struct_type(this);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_548,this,pSVar6,0);
      convert_to_string<unsigned_int,_0>(local_568,&(this->msl_options).shader_input_buffer_index);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                (local_528,(char (*) [14])"const device ",local_548,(char (*) [3])0x5e923a,
                 &this->input_buffer_var_name,(char (*) [11])0x5feead,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568,
                 (char (*) [4])")]]");
      ::std::__cxx11::string::operator+=
                ((string *)active_builtins.stack_storage.aligned_char._120_8_,(string *)local_528);
      ::std::__cxx11::string::~string((string *)local_528);
      ::std::__cxx11::string::~string((string *)local_568);
      ::std::__cxx11::string::~string((string *)local_548);
    }
  }
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::~SmallVector
            ((SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> *)local_b0);
  return;
}

Assistant:

void CompilerMSL::entry_point_args_builtin(string &ep_args)
{
	// Builtin variables
	SmallVector<pair<SPIRVariable *, BuiltIn>, 8> active_builtins;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if (var.storage != StorageClassInput)
			return;

		auto bi_type = BuiltIn(get_decoration(var_id, DecorationBuiltIn));

		// Don't emit SamplePosition as a separate parameter. In the entry
		// point, we get that by calling get_sample_position() on the sample ID.
		if (is_builtin_variable(var) &&
		    get_variable_data_type(var).basetype != SPIRType::Struct &&
		    get_variable_data_type(var).basetype != SPIRType::ControlPointArray)
		{
			// If the builtin is not part of the active input builtin set, don't emit it.
			// Relevant for multiple entry-point modules which might declare unused builtins.
			if (!active_input_builtins.get(bi_type) || !interface_variable_exists_in_entry_point(var_id))
				return;

			// Remember this variable. We may need to correct its type.
			active_builtins.push_back(make_pair(&var, bi_type));

			if (is_direct_input_builtin(bi_type))
			{
				if (!ep_args.empty())
					ep_args += ", ";

				// Handle HLSL-style 0-based vertex/instance index.
				builtin_declaration = true;

				// Handle different MSL gl_TessCoord types. (float2, float3)
				if (bi_type == BuiltInTessCoord && get_entry_point().flags.get(ExecutionModeQuads))
					ep_args += "float2 " + to_expression(var_id) + "In";
				else
					ep_args += builtin_type_decl(bi_type, var_id) + " " + to_expression(var_id);

				ep_args += " [[" + builtin_qualifier(bi_type);
				if (bi_type == BuiltInSampleMask && get_entry_point().flags.get(ExecutionModePostDepthCoverage))
				{
					if (!msl_options.supports_msl_version(2))
						SPIRV_CROSS_THROW("Post-depth coverage requires MSL 2.0.");
					if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
						SPIRV_CROSS_THROW("Post-depth coverage on Mac requires MSL 2.3.");
					ep_args += ", post_depth_coverage";
				}
				ep_args += "]]";
				builtin_declaration = false;
			}
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInDispatchBase))
		{
			// This is a special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the base that was passed to vkCmdDispatchBase() or vkCmdDrawIndexed(). If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_origin]]";
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInStageInputSize))
		{
			// This is another special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the number of vertices and instances to draw. If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_size]]";
		}
	});

	// Correct the types of all encountered active builtins. We couldn't do this before
	// because ensure_correct_builtin_type() may increase the bound, which isn't allowed
	// while iterating over IDs.
	for (auto &var : active_builtins)
		var.first->basetype = ensure_correct_builtin_type(var.first->basetype, var.second);

	// Handle HLSL-style 0-based vertex/instance index.
	if (needs_base_vertex_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseVertex, !ep_args.empty());

	if (needs_base_instance_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseInstance, !ep_args.empty());

	if (capture_output_to_buffer)
	{
		// Add parameters to hold the indirect draw parameters and the shader output. This has to be handled
		// specially because it needs to be a pointer, not a reference.
		if (stage_out_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", type_to_glsl(get_stage_out_struct_type()), "* ", output_buffer_var_name,
			                " [[buffer(", msl_options.shader_output_buffer_index, ")]]");
		}

		if (is_tesc_shader())
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("constant uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}
		else if (stage_out_var_id &&
		         !(get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("device uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}

		if (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation &&
		    (active_input_builtins.get(BuiltInVertexIndex) || active_input_builtins.get(BuiltInVertexId)) &&
		    msl_options.vertex_index_type != Options::IndexType::None)
		{
			// Add the index buffer so we can set gl_VertexIndex correctly.
			if (!ep_args.empty())
				ep_args += ", ";
			switch (msl_options.vertex_index_type)
			{
			case Options::IndexType::None:
				break;
			case Options::IndexType::UInt16:
				ep_args += join("const device ushort* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			case Options::IndexType::UInt32:
				ep_args += join("const device uint* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			}
		}

		// Tessellation control shaders get three additional parameters:
		// a buffer to hold the per-patch data, a buffer to hold the per-patch
		// tessellation levels, and a block of workgroup memory to hold the
		// input control point data.
		if (is_tesc_shader())
		{
			if (patch_stage_out_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    join("device ", type_to_glsl(get_patch_stage_out_struct_type()), "* ", patch_output_buffer_var_name,
				         " [[buffer(", convert_to_string(msl_options.shader_patch_output_buffer_index), ")]]");
			}
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name, " [[buffer(",
			                convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");

			// Initializer for tess factors must be handled specially since it's never declared as a normal variable.
			uint32_t outer_factor_initializer_id = 0;
			uint32_t inner_factor_initializer_id = 0;
			ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
				if (!has_decoration(var.self, DecorationBuiltIn) || var.storage != StorageClassOutput || !var.initializer)
					return;

				BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				if (builtin == BuiltInTessLevelInner)
					inner_factor_initializer_id = var.initializer;
				else if (builtin == BuiltInTessLevelOuter)
					outer_factor_initializer_id = var.initializer;
			});

			const SPIRConstant *c = nullptr;

			if (outer_factor_initializer_id && (c = maybe_get<SPIRConstant>(outer_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [=]()
				    {
					    uint32_t components = is_tessellating_triangles() ? 3 : 4;
					    for (uint32_t i = 0; i < components; i++)
					    {
						    statement(builtin_to_glsl(BuiltInTessLevelOuter, StorageClassOutput), "[", i,
						              "] = ", "half(", to_expression(c->subconstants[i]), ");");
					    }
				    });
			}

			if (inner_factor_initializer_id && (c = maybe_get<SPIRConstant>(inner_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				if (is_tessellating_triangles())
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), " = ", "half(",
						          to_expression(c->subconstants[0]), ");");
					});
				}
				else
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						for (uint32_t i = 0; i < 2; i++)
						{
							statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), "[", i, "] = ",
							          "half(", to_expression(c->subconstants[i]), ");");
						}
					});
				}
			}

			if (stage_in_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				if (msl_options.multi_patch_workgroup)
				{
					ep_args += join("device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
					                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
				}
				else
				{
					ep_args += join("threadgroup ", type_to_glsl(get_stage_in_struct_type()), "* ", input_wg_var_name,
					                " [[threadgroup(", convert_to_string(msl_options.shader_input_wg_index), ")]]");
				}
			}
		}
	}
	// Tessellation evaluation shaders get three additional parameters:
	// a buffer for the per-patch data, a buffer for the per-patch
	// tessellation levels, and a buffer for the control point data.
	if (is_tese_shader() && msl_options.raw_buffer_tese_input)
	{
		if (patch_stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("const device ", type_to_glsl(get_patch_stage_in_struct_type()), "* ", patch_input_buffer_var_name,
			         " [[buffer(", convert_to_string(msl_options.shader_patch_input_buffer_index), ")]]");
		}

		if (tess_level_inner_var_id || tess_level_outer_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");
		}

		if (stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
		}
	}
}